

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_bspline.cpp
# Opt level: O0

double __thiscall agg::bspline::extrapolation_right(bspline *this,double x)

{
  double *pdVar1;
  double dVar2;
  double d;
  double x_local;
  bspline *this_local;
  
  dVar2 = this->m_x[this->m_num + -1] - this->m_x[this->m_num + -2];
  pdVar1 = pod_array<double>::operator[](&this->m_am,this->m_num - 2);
  return ((dVar2 * *pdVar1) / 6.0 +
         (this->m_y[this->m_num + -1] - this->m_y[this->m_num + -2]) / dVar2) *
         (x - this->m_x[this->m_num + -1]) + this->m_y[this->m_num + -1];
}

Assistant:

double bspline::extrapolation_right(double x) const
    {
        double d = m_x[m_num - 1] - m_x[m_num - 2];
        return (d * m_am[m_num - 2] / 6 + (m_y[m_num - 1] - m_y[m_num - 2]) / d) * 
               (x - m_x[m_num - 1]) + 
               m_y[m_num - 1];
    }